

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.hpp
# Opt level: O0

TernaryOp * __thiscall verilogAST::TernaryOp::clone_impl(TernaryOp *this)

{
  TernaryOp *this_00;
  pointer pEVar1;
  int in_ECX;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  void *in_R8;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_38;
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_30 [3];
  unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_> local_18;
  TernaryOp *local_10;
  TernaryOp *this_local;
  
  local_10 = this;
  this_00 = (TernaryOp *)operator_new(0x20);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->cond);
  Expression::clone((Expression *)&local_18,(__fn *)pEVar1,__child_stack,in_ECX,in_R8);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->true_value);
  Expression::clone((Expression *)local_30,(__fn *)pEVar1,__child_stack_00,in_ECX,in_R8);
  pEVar1 = std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::
           operator->(&this->false_value);
  Expression::clone((Expression *)&local_38,(__fn *)pEVar1,__child_stack_01,in_ECX,in_R8);
  TernaryOp(this_00,&local_18,local_30,&local_38);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_38);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (local_30);
  std::unique_ptr<verilogAST::Expression,_std::default_delete<verilogAST::Expression>_>::~unique_ptr
            (&local_18);
  return this_00;
}

Assistant:

virtual TernaryOp* clone_impl() const override {
    return new TernaryOp(this->cond->clone(), this->true_value->clone(),
                         this->false_value->clone());
  }